

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O2

int32_t __thiscall avro::BinaryDecoder::decodeInt(BinaryDecoder *this)

{
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  int64_t val;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  
  val = doDecodeLong(this);
  if ((int)val == val) {
    return (int)val;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f8,"Value out of range for Avro int: %1%");
  msg = boost::io::detail::feed<char,std::char_traits<char>,std::allocator<char>,long&>
                  (&local_f8,&val);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

int32_t BinaryDecoder::decodeInt()
{
    int64_t val = doDecodeLong();
    if (val < INT32_MIN || val > INT32_MAX) {
        throw Exception(
            boost::format("Value out of range for Avro int: %1%") % val);
    }
    return static_cast<int32_t>(val);
}